

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
HecrSequential_cyclicReductionLargeSystem_Test::~HecrSequential_cyclicReductionLargeSystem_Test
          (HecrSequential_cyclicReductionLargeSystem_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HecrSequential, cyclicReductionLargeSystem)
{
    int size = 65535;
    int actual_size = 47000;
    double a = 3.21;
    double bc = 1.4;
    double x = -0.7;
    double rhs_middle = -4.207;
    double rhs_end = -3.227;
    vec as(size, 1.0);
    vec bs(size, 0.0);
    vec cs(size, 0.0);

    as[0] = a;
    cs[0] = bc;
    for (int i = 1; i < actual_size - 1; i++)
    {
        as[i] = a;
        bs[i] = bc;
        cs[i] = bc;
    }
    as[actual_size - 1] = a;
    bs[actual_size - 1] = bc;

    TridiagonalMatrix m(as, bs, cs);

    vec rhs(size, 0.0);
    rhs[0] = rhs_end;
    for (int i = 1; i < actual_size - 1; i++)
    {
        rhs[i] = rhs_middle;
    }
    rhs[actual_size - 1] = rhs_end;

    vec xs(size, 0.0);
    for (int i = 0; i < actual_size; i++)
    {
        xs[i] = x;
    }

    vec solution = cyclic_reduction(m, rhs);

    EXPECT_LT(max_diff(xs, solution), EPS);
}